

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::flyd_close_listening_sockets(CSocekt *this)

{
  SourceFile file;
  SourceFile file_00;
  LogLevel LVar1;
  reference ppfVar2;
  long in_RDI;
  int i;
  self *in_stack_ffffffffffffdfc8;
  int v;
  Logger *in_stack_ffffffffffffdfd0;
  LogStream *in_stack_ffffffffffffdfd8;
  SourceFile *in_stack_ffffffffffffdfe0;
  LogStream *in_stack_ffffffffffffdfe8;
  Logger *in_stack_ffffffffffffdff0;
  Logger *this_00;
  Logger *in_stack_ffffffffffffe000;
  Logger local_1fe0;
  Logger local_fe8;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x70); local_c = local_c + 1) {
    LVar1 = muduo::Logger::logLevel();
    v = (int)((ulong)in_stack_ffffffffffffdfc8 >> 0x20);
    if ((int)LVar1 < 2) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffffdfe0,(char (*) [100])in_stack_ffffffffffffdfd8);
      this_00 = &local_fe8;
      file_00._8_8_ = in_stack_ffffffffffffe000;
      file_00.data_ = (char *)this_00;
      muduo::Logger::Logger
                (in_stack_ffffffffffffdff0,file_00,(int)((ulong)in_stack_ffffffffffffdfe8 >> 0x20),
                 (LogLevel)in_stack_ffffffffffffdfe8,(char *)in_stack_ffffffffffffdfe0);
      in_stack_ffffffffffffe000 = (Logger *)muduo::Logger::stream(this_00);
      in_stack_ffffffffffffdff0 =
           (Logger *)
           muduo::LogStream::operator<<
                     ((LogStream *)in_stack_ffffffffffffdfe0,(char *)in_stack_ffffffffffffdfd8);
      std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::operator[]
                ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)(in_RDI + 0x130)
                 ,(long)local_c);
      in_stack_ffffffffffffdfe8 =
           muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdfd0,v);
      in_stack_ffffffffffffdfe0 =
           (SourceFile *)
           muduo::LogStream::operator<<
                     ((LogStream *)in_stack_ffffffffffffdfe0,(char *)in_stack_ffffffffffffdfd8);
      std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::operator[]
                ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)(in_RDI + 0x130)
                 ,(long)local_c);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdfd0,v);
      muduo::Logger::~Logger(in_stack_ffffffffffffe000);
    }
    ppfVar2 = std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::operator[]
                        ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)
                         (in_RDI + 0x130),(long)local_c);
    close((*ppfVar2)->fd);
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffffdfe0,(char (*) [100])in_stack_ffffffffffffdfd8);
      in_stack_ffffffffffffdfd0 = &local_1fe0;
      file._8_8_ = in_stack_ffffffffffffdfe0;
      file.data_ = (char *)in_stack_ffffffffffffdfd8;
      muduo::Logger::Logger(in_stack_ffffffffffffdfd0,file,v);
      in_stack_ffffffffffffdfd8 = muduo::Logger::stream(in_stack_ffffffffffffdfd0);
      in_stack_ffffffffffffdfc8 =
           muduo::LogStream::operator<<
                     ((LogStream *)in_stack_ffffffffffffdfe0,(char *)in_stack_ffffffffffffdfd8);
      std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::operator[]
                ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)(in_RDI + 0x130)
                 ,(long)local_c);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffdfd0,
                 (int)((ulong)in_stack_ffffffffffffdfc8 >> 0x20));
      muduo::Logger::~Logger(in_stack_ffffffffffffe000);
    }
  }
  return;
}

Assistant:

void CSocekt::flyd_close_listening_sockets()
{
    for(int i = 0; i < m_ListenPortCount; i++) //要关闭这么多个监听端口
    {
        //ngx_log_stderr(0,"端口是%d,socketid是%d.",m_ListenSocketList[i]->port,m_ListenSocketList[i]->fd);
        LOG_DEBUG << "端口是 " << m_ListenSocketList[i]->port << "socketid是" << m_ListenSocketList[i]->fd;
        close(m_ListenSocketList[i]->fd);
        LOG_INFO << "关闭监听端口" << m_ListenSocketList[i]->port;
        //ngx_log_error_core(NGX_LOG_INFO,0,"关闭监听端口%d!",m_ListenSocketList[i]->port); //显示一些信息到日志中
    }//end for(int i = 0; i < m_ListenPortCount; i++)
}